

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.hpp
# Opt level: O1

void __thiscall
unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::push
          (iterator *this,iter_result *e)

{
  ulong uVar1;
  iter_result<unodb::detail::node_header> local_30;
  
  uVar1 = (e->node).tagged_ptr;
  if ((uVar1 & 7) == 0) {
    local_30.key_byte = 0xff;
    local_30.child_index = 0xff;
    local_30.prefix.u64 = 0;
    local_30.node.tagged_ptr = uVar1;
    std::
    deque<unodb::detail::iter_result<unodb::detail::node_header>,std::allocator<unodb::detail::iter_result<unodb::detail::node_header>>>
    ::emplace_back<unodb::detail::iter_result<unodb::detail::node_header>>
              ((deque<unodb::detail::iter_result<unodb::detail::node_header>,std::allocator<unodb::detail::iter_result<unodb::detail::node_header>>>
                *)&this->stack_,&local_30);
  }
  push(this,(node_ptr)(e->node).tagged_ptr,e->key_byte,e->child_index,e->prefix);
  return;
}

Assistant:

void push(const typename inode_base::iter_result& e) {
      const auto node_type = e.node.type();
      if (UNODB_DETAIL_UNLIKELY(node_type == node_type::LEAF)) {
        push_leaf(e.node);
      }
      push(e.node, e.key_byte, e.child_index, e.prefix);
    }